

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_sampling_bagwell(uchar **strings,size_t n)

{
  byte bVar1;
  uchar *puVar2;
  pointer ppvVar3;
  ulong uVar4;
  bool bVar5;
  ostream *poVar6;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *root;
  undefined8 *puVar7;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *this;
  int iVar8;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"pseudo_sample",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): sampling ",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," strings ...\n",0xd);
  root = (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar9 = 5000;
    in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x0;
    do {
      puVar2 = strings[(long)in_RCX];
      if (puVar2 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      lVar11 = 0;
      this = root;
      do {
        bVar1 = puVar2[lVar11];
        uVar10 = (ulong)bVar1;
        if (bVar1 == 0) {
          bVar5 = false;
          iVar8 = 6;
        }
        else {
          if ((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < uVar10 + 1) {
            std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,uVar10 + 1);
          }
          lVar11 = lVar11 + 1;
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3) <=
               uVar10) || (((ulong)ppvVar3[uVar10] & 1) == 0)) {
            puVar7 = (undefined8 *)operator_new(0x18);
            *puVar7 = 0;
            puVar7[1] = 0;
            puVar7[2] = 0;
            *(undefined8 **)
             ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)((uint)bVar1 * 8)) = puVar7;
            ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar4 = *(ulong *)((long)ppvVar3 + (ulong)((uint)bVar1 * 8));
            if (uVar4 == 0) {
              __assert_fail("ptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                            ,0x5c,"void make_trie(void *&)");
            }
            ppvVar3[uVar10] = (void *)(uVar4 | 1);
            lVar9 = lVar9 + -1;
            if (lVar9 == 0) {
              bVar5 = false;
              iVar8 = 7;
              lVar9 = 0;
              goto LAB_002103c6;
            }
          }
          this = TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::get_node
                           (this,(uint)bVar1);
          if (this == (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xd9,
                          "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_bagwell<unsigned char *>]"
                         );
          }
          iVar8 = 0;
          bVar5 = true;
        }
LAB_002103c6:
      } while (iVar8 == 0);
      if (iVar8 == 6) {
        bVar5 = true;
      }
      in_RCX = in_RCX + 0x2000;
    } while ((in_RCX < n) && (bVar5));
  }
  insert<16384u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_bagwell<unsigned_char*,16u>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_bagwell(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}